

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

bool __thiscall HttpRequest::handle_headers(HttpRequest *this,CharContent *line,Request *ret)

{
  size_t length;
  size_t sVar1;
  iterator iVar2;
  mapped_type *this_00;
  bool bVar3;
  CharContent value;
  CharContent key;
  CharContent CStack_c8;
  CharContent local_a0;
  CharContent local_78;
  CharContent local_50;
  
  CharContent::CharContent(&local_a0,":");
  length = CharContent::find(line,&local_a0,0);
  sVar1 = line->npos;
  CharContent::~CharContent(&local_a0);
  if (length == sVar1) {
    bVar3 = false;
  }
  else {
    CharContent::subCharContent(&local_a0,line,0,length);
    CharContent::CharContent(&local_78," ");
    CharContent::strip(&CStack_c8,&local_a0,&local_78);
    CharContent::operator=(&local_a0,&CStack_c8);
    CharContent::~CharContent(&CStack_c8);
    CharContent::~CharContent(&local_78);
    sVar1 = CharContent::length(line);
    CharContent::subCharContent(&CStack_c8,line,length + 1,sVar1 + ~length);
    CharContent::CharContent(&local_50," ");
    CharContent::strip(&local_78,&CStack_c8,&local_50);
    CharContent::operator=(&CStack_c8,&local_78);
    CharContent::~CharContent(&local_78);
    CharContent::~CharContent(&local_50);
    iVar2 = std::
            _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(ret->headers)._M_h,&local_a0);
    bVar3 = iVar2.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>._M_cur
            == (__node_type *)0x0;
    if (bVar3) {
      this_00 = std::__detail::
                _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&ret->headers,&local_a0);
      CharContent::operator=(this_00,&CStack_c8);
    }
    CharContent::~CharContent(&CStack_c8);
    CharContent::~CharContent(&local_a0);
  }
  return bVar3;
}

Assistant:

bool HttpRequest::handle_headers(CharContent line,Request *ret){
	size_t pos=0;
	if((pos=line.find(":"))==line.npos){
		return false;
	}
	CharContent key=line.subCharContent(0,pos);
	key=key.strip(" ");
	CharContent value=line.subCharContent(pos+1,line.length()-pos-1);
	value=value.strip(" ");
	if(ret->headers.find(key)!=ret->headers.end()){
		return false;
	}
	ret->headers[key]=value;
	return true;
}